

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::prepare(WasmBinaryWriter *this)

{
  IndexedHeapTypes *pIVar1;
  Module *wasm;
  ImportInfo *__ptr;
  undefined1 auVar2 [16];
  WasmBinaryWriter *pWVar3;
  HeapTypeKind HVar4;
  ulong uVar5;
  ImportInfo *this_00;
  long lVar6;
  ulong uVar7;
  pointer __p;
  __hashtable *__h;
  Signature local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined1 local_70 [56];
  WasmBinaryWriter *local_38;
  
  wasm::ModuleUtils::getOptimizedIndexedHeapTypes((IndexedHeapTypes *)&local_88,this->wasm);
  pIVar1 = &this->indexedTypes;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign
            (&pIVar1->types,(IndexedHeapTypes *)&local_88);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->indexedTypes).indices._M_h,local_70);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_70);
  if (local_88.params.id != 0) {
    operator_delete((void *)local_88.params.id,CONCAT44(uStack_74,local_78) - local_88.params.id);
  }
  uVar5 = (ulong)((long)(this->indexedTypes).types.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->indexedTypes).types.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_38 = this;
  if ((int)uVar5 != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      HVar4 = HeapType::getKind((HeapType *)
                                ((long)&((pIVar1->types).
                                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->id + lVar6));
      if (HVar4 == Func) {
        local_88 = HeapType::getSignature
                             ((HeapType *)
                              ((long)&((pIVar1->types).
                                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->id + lVar6));
        local_78 = (undefined4)uVar7;
        std::
        _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<wasm::Signature_const,unsigned_int>>
                  ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->signatureIndexes,&local_88);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 8;
    } while ((uVar5 & 0xffffffff) != uVar7);
  }
  pWVar3 = local_38;
  wasm = local_38->wasm;
  this_00 = (ImportInfo *)operator_new(0x80);
  ImportInfo::ImportInfo(this_00,wasm);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_88.results.id;
  local_88 = (Signature)(auVar2 << 0x40);
  __ptr = (pWVar3->importInfo)._M_t.
          super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
          super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
          super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl;
  (pWVar3->importInfo)._M_t.
  super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
  super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl = this_00;
  if (__ptr != (ImportInfo *)0x0) {
    std::default_delete<wasm::ImportInfo>::operator()
              ((default_delete<wasm::ImportInfo> *)&pWVar3->importInfo,__ptr);
  }
  if ((ImportInfo *)local_88.params.id != (ImportInfo *)0x0) {
    std::default_delete<wasm::ImportInfo>::operator()
              ((default_delete<wasm::ImportInfo> *)&local_88,(ImportInfo *)local_88.params.id);
  }
  return;
}

Assistant:

void WasmBinaryWriter::prepare() {
  // Collect function types and their frequencies. Collect information in each
  // function in parallel, then merge.
  indexedTypes = ModuleUtils::getOptimizedIndexedHeapTypes(*wasm);
  for (Index i = 0, size = indexedTypes.types.size(); i < size; ++i) {
    if (indexedTypes.types[i].isSignature()) {
      signatureIndexes.insert({indexedTypes.types[i].getSignature(), i});
    }
  }
  importInfo = std::make_unique<ImportInfo>(*wasm);
}